

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_binder.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::CheckBinder::BindExpression
          (BindResult *__return_storage_ptr__,CheckBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  ExpressionClass EVar1;
  BaseExpression *this_00;
  ColumnRefExpression *colref;
  string local_40;
  
  this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(expr_ptr)->super_BaseExpression;
  EVar1 = this_00->expression_class;
  if (EVar1 == COLUMN_REF) {
    colref = BaseExpression::Cast<duckdb::ColumnRefExpression>(this_00);
    BindCheckColumn(__return_storage_ptr__,this,colref);
  }
  else {
    if (EVar1 == SUBQUERY) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"cannot use subquery in check constraint","");
      BindResult::BindResult(__return_storage_ptr__,&local_40);
    }
    else {
      if (EVar1 != WINDOW) {
        ExpressionBinder::BindExpression
                  (__return_storage_ptr__,&this->super_ExpressionBinder,expr_ptr,depth,false);
        return __return_storage_ptr__;
      }
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"window functions are not allowed in check constraints","");
      BindResult::BindResult(__return_storage_ptr__,&local_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult CheckBinder::BindExpression(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	auto &expr = *expr_ptr;
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::WINDOW:
		return BindResult("window functions are not allowed in check constraints");
	case ExpressionClass::SUBQUERY:
		return BindResult("cannot use subquery in check constraint");
	case ExpressionClass::COLUMN_REF:
		return BindCheckColumn(expr.Cast<ColumnRefExpression>());
	default:
		return ExpressionBinder::BindExpression(expr_ptr, depth);
	}
}